

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Trivia __thiscall
slang::parsing::Preprocessor::handleBeginKeywordsDirective(Preprocessor *this,Token directive)

{
  BeginKeywordsDirectiveSyntax *syntax;
  SourceRange range;
  optional<slang::parsing::KeywordVersion> versionOpt;
  Token versionToken;
  Token directive_local;
  Trivia in_stack_ffffffffffffffe8;
  
  directive_local.info = directive.info;
  directive_local._0_8_ = directive._0_8_;
  checkOutsideDesignElement(this,directive);
  versionToken = expect(this,StringLiteral);
  if ((versionToken._0_4_ >> 0x10 & 1) == 0) {
    Token::valueText(&versionToken);
    versionOpt = LexerFacts::getKeywordVersion((string_view)in_stack_ffffffffffffffe8);
    if (((ushort)versionOpt.super__Optional_base<slang::parsing::KeywordVersion,_true,_true>.
                 _M_payload.super__Optional_payload_base<slang::parsing::KeywordVersion> >> 8 & 1)
        == 0) {
      range = Token::range(&versionToken);
      addDiag(this,(DiagCode)0x1b0004,range);
    }
    else {
      std::vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>::
      push_back(&this->keywordVersionStack,(value_type *)&versionOpt);
    }
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::BeginKeywordsDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&directive_local,&versionToken);
  Trivia::Trivia((Trivia *)&stack0xffffffffffffffe8,Directive,(SyntaxNode *)syntax);
  return in_stack_ffffffffffffffe8;
}

Assistant:

Trivia Preprocessor::handleBeginKeywordsDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token versionToken = expect(TokenKind::StringLiteral);
    if (!versionToken.isMissing()) {
        auto versionOpt = LF::getKeywordVersion(versionToken.valueText());
        if (!versionOpt)
            addDiag(diag::UnrecognizedKeywordVersion, versionToken.range());
        else
            keywordVersionStack.push_back(*versionOpt);
    }

    auto result = alloc.emplace<BeginKeywordsDirectiveSyntax>(directive, versionToken);
    return Trivia(TriviaKind::Directive, result);
}